

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::litRedundant(Solver *this,Lit p)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  ShrinkStackElem *pSVar5;
  int iVar6;
  int iVar7;
  VarData *pVVar8;
  uint *puVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  Lit local_4c;
  ShrinkStackElem local_48;
  vec<Minisat::Solver::ShrinkStackElem,_int> *local_40;
  vec<Minisat::Lit,_int> *local_38;
  
  iVar6 = p.x >> 1;
  local_4c.x = p.x;
  if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar6) {
LAB_0010b06b:
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                  ,0x28,
                  "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  if (1 < (byte)(this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar6])
  {
    __assert_fail("seen[var(p)] == seen_undef || seen[var(p)] == seen_source",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x187,"bool Minisat::Solver::litRedundant(Lit)");
  }
  iVar7 = (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>
          .map.sz;
  if (iVar7 <= iVar6) {
LAB_0010b04c:
    __assert_fail("has(k)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                  ,0x27,
                  "const V &Minisat::IntMap<int, Minisat::Solver::VarData>::operator[](K) const [K = int, V = Minisat::Solver::VarData, MkIndex = Minisat::MkIndexDefault<int>]"
                 );
  }
  pVVar8 = (this->vardata).
           super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
  uVar10 = pVVar8[iVar6].reason;
  if ((ulong)uVar10 == 0xffffffff) {
    __assert_fail("reason(var(p)) != CRef_Undef",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/core/Solver.cc"
                  ,0x188,"bool Minisat::Solver::litRedundant(Lit)");
  }
  if ((this->ca).ra.sz <= uVar10) {
LAB_0010b08a:
    __assert_fail("r < sz",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Alloc.h"
                  ,0x3f,
                  "T &Minisat::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]");
  }
  if ((this->analyze_stack).data != (ShrinkStackElem *)0x0) {
    (this->analyze_stack).sz = 0;
  }
  puVar9 = (this->ca).ra.memory + uVar10;
  local_40 = &this->analyze_stack;
  local_38 = &this->analyze_toclear;
  uVar10 = 1;
LAB_0010ae57:
  uVar2 = *puVar9;
  if (uVar10 < uVar2 >> 5) {
    uVar3 = puVar9[(ulong)uVar10 + 1];
    iVar6 = (int)uVar3 >> 1;
    if (iVar7 <= iVar6) goto LAB_0010b04c;
    if (pVVar8[iVar6].level != 0) {
      if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar6)
      goto LAB_0010b06b;
      cVar1 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar6];
      if (1 < (byte)(cVar1 - 1U)) {
        local_48.l.x = p.x;
        if ((cVar1 == '\x03') || (pVVar8[iVar6].reason == 0xffffffff)) {
          local_48.i = 0;
          vec<Minisat::Solver::ShrinkStackElem,_int>::push(local_40,&local_48);
          iVar6 = (this->analyze_stack).sz;
          if (iVar6 < 1) goto LAB_0010b037;
          lVar12 = 4;
          lVar11 = 0;
          while (iVar7 = *(int *)((long)&((this->analyze_stack).data)->i + lVar12) >> 1,
                iVar7 < (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz)
          {
            pcVar4 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
            if (pcVar4[iVar7] == '\0') {
              pcVar4[iVar7] = '\x03';
              vec<Minisat::Lit,_int>::push
                        (local_38,(Lit *)((long)&((this->analyze_stack).data)->i + lVar12));
              iVar6 = (this->analyze_stack).sz;
            }
            lVar11 = lVar11 + 1;
            lVar12 = lVar12 + 8;
            if (iVar6 <= lVar11) {
LAB_0010b037:
              return uVar2 >> 5 <= uVar10;
            }
          }
          goto LAB_0010b06b;
        }
        local_48.i = uVar10;
        vec<Minisat::Solver::ShrinkStackElem,_int>::push(local_40,&local_48);
        iVar7 = (this->vardata).
                super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz;
        local_4c.x = uVar3;
        if (iVar7 <= iVar6) goto LAB_0010b04c;
        pVVar8 = (this->vardata).
                 super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data
        ;
        if ((this->ca).ra.sz <= pVVar8[iVar6].reason) goto LAB_0010b08a;
        puVar9 = (this->ca).ra.memory + pVVar8[iVar6].reason;
        uVar10 = 0;
        p.x = uVar3;
      }
    }
  }
  else {
    iVar6 = p.x >> 1;
    if ((this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar6)
    goto LAB_0010b06b;
    pcVar4 = (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
    if (pcVar4[iVar6] == '\0') {
      pcVar4[iVar6] = '\x02';
      vec<Minisat::Lit,_int>::push(local_38,&local_4c);
    }
    iVar6 = (this->analyze_stack).sz;
    lVar11 = (long)iVar6;
    if (lVar11 == 0) goto LAB_0010b037;
    pSVar5 = (this->analyze_stack).data;
    uVar10 = pSVar5[lVar11 + -1].i;
    local_4c.x = pSVar5[lVar11 + -1].l.x;
    iVar7 = (this->vardata).
            super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz;
    if (iVar7 <= local_4c.x >> 1) goto LAB_0010b04c;
    pVVar8 = (this->vardata).
             super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.data;
    if ((this->ca).ra.sz <= pVVar8[local_4c.x >> 1].reason) goto LAB_0010b08a;
    if (iVar6 < 1) {
      __assert_fail("sz > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/Vec.h"
                    ,0x4e,
                    "void Minisat::vec<Minisat::Solver::ShrinkStackElem>::pop() [T = Minisat::Solver::ShrinkStackElem, _Size = int]"
                   );
    }
    puVar9 = (this->ca).ra.memory + pVVar8[local_4c.x >> 1].reason;
    (this->analyze_stack).sz = iVar6 + -1;
    p.x = local_4c.x;
  }
  uVar10 = uVar10 + 1;
  goto LAB_0010ae57;
}

Assistant:

bool Solver::litRedundant(Lit p)
{
    enum { seen_undef = 0, seen_source = 1, seen_removable = 2, seen_failed = 3 };
    assert(seen[var(p)] == seen_undef || seen[var(p)] == seen_source);
    assert(reason(var(p)) != CRef_Undef);

    Clause*               c     = &ca[reason(var(p))];
    vec<ShrinkStackElem>& stack = analyze_stack;
    stack.clear();

    for (uint32_t i = 1; ; i++){
        if (i < (uint32_t)c->size()){
            // Checking 'p'-parents 'l':
            Lit l = (*c)[i];
            
            // Variable at level 0 or previously removable:
            if (level(var(l)) == 0 || seen[var(l)] == seen_source || seen[var(l)] == seen_removable){
                continue; }
            
            // Check variable can not be removed for some local reason:
            if (reason(var(l)) == CRef_Undef || seen[var(l)] == seen_failed){
                stack.push(ShrinkStackElem(0, p));
                for (int i = 0; i < stack.size(); i++)
                    if (seen[var(stack[i].l)] == seen_undef){
                        seen[var(stack[i].l)] = seen_failed;
                        analyze_toclear.push(stack[i].l);
                    }
                    
                return false;
            }

            // Recursively check 'l':
            stack.push(ShrinkStackElem(i, p));
            i  = 0;
            p  = l;
            c  = &ca[reason(var(p))];
        }else{
            // Finished with current element 'p' and reason 'c':
            if (seen[var(p)] == seen_undef){
                seen[var(p)] = seen_removable;
                analyze_toclear.push(p);
            }

            // Terminate with success if stack is empty:
            if (stack.size() == 0) break;
            
            // Continue with top element on stack:
            i  = stack.last().i;
            p  = stack.last().l;
            c  = &ca[reason(var(p))];

            stack.pop();
        }
    }

    return true;
}